

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_reader.cc
# Opt level: O1

bool __thiscall xsettingsd::DataReader::ReadBytes(DataReader *this,string *out,size_t size)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  
  uVar2 = this->bytes_read_;
  uVar1 = uVar2 + size;
  bVar3 = uVar1 <= this->buf_len_;
  if (uVar2 <= uVar1 && bVar3) {
    if (out != (string *)0x0) {
      std::__cxx11::string::_M_replace
                ((ulong)out,0,(char *)out->_M_string_length,(ulong)(this->buffer_ + uVar2));
    }
    this->bytes_read_ = this->bytes_read_ + size;
  }
  return uVar2 <= uVar1 && bVar3;
}

Assistant:

bool DataReader::ReadBytes(string* out, size_t size) {
  if (bytes_read_ + size > buf_len_ ||
      bytes_read_ + size < bytes_read_) {
    return false;
  }
  if (out)
    out->assign(buffer_ + bytes_read_, size);
  bytes_read_ += size;
  return true;
}